

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

int x509v3_conf_name_matches(char *name,char *cmp)

{
  int iVar1;
  size_t __n;
  bool local_29;
  size_t len;
  char *cmp_local;
  char *name_local;
  
  __n = strlen(cmp);
  iVar1 = strncmp(name,cmp,__n);
  if (iVar1 == 0) {
    local_29 = true;
    if (name[__n] != '\0') {
      local_29 = name[__n] == '.';
    }
    name_local._4_4_ = (uint)local_29;
  }
  else {
    name_local._4_4_ = 0;
  }
  return name_local._4_4_;
}

Assistant:

int x509v3_conf_name_matches(const char *name, const char *cmp) {
  // |name| must begin with |cmp|.
  size_t len = strlen(cmp);
  if (strncmp(name, cmp, len) != 0) {
    return 0;
  }
  // |name| must either be equal to |cmp| or begin with |cmp|, followed by '.'.
  return name[len] == '\0' || name[len] == '.';
}